

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Color.cpp
# Opt level: O3

string * __thiscall Color::colorize(string *__return_storage_ptr__,Color *this,string *input)

{
  pointer pcVar1;
  uint uVar2;
  ostream *poVar3;
  char cVar4;
  uint uVar5;
  stringstream result;
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  if (this->_value == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (input->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + input->_M_string_length);
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream(local_1b0);
  uVar2 = this->_value;
  if ((uVar2 >> 0x15 & 1) != 0) {
    uVar5 = uVar2 & 0x40000;
    if (uVar5 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"\x1b[4m",4);
      uVar2 = this->_value;
    }
    if ((uVar2 >> 0x16 & 1) == 0) {
      cVar4 = (char)(uVar5 >> 0x12);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"\x1b[7m",4);
      uVar2 = this->_value;
      cVar4 = '\x01';
    }
    if ((uVar2 >> 0x13 & 1) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"\x1b[38;5;",7);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"m",1);
      uVar2 = this->_value;
      cVar4 = '\x01';
    }
    if ((uVar2 >> 0x14 & 1) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"\x1b[48;5;",7);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
      cVar4 = '\x01';
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"m",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a0,(input->_M_dataplus)._M_p,input->_M_string_length);
    if (cVar4 != '\0') {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"\x1b[0m",4);
    }
    std::__cxx11::stringbuf::str();
    goto LAB_0010d1e9;
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"\x1b[",2);
  uVar2 = this->_value;
  if ((uVar2 >> 0x11 & 1) == 0) {
    if ((uVar2 >> 0x12 & 1) != 0) {
LAB_0010d0f9:
      std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"4",1);
      uVar2 = this->_value;
      goto LAB_0010d110;
    }
    if ((uVar2 >> 0x16 & 1) != 0) goto LAB_0010d12a;
    if ((uVar2 >> 0x13 & 1) != 0) goto LAB_0010d15f;
    if ((uVar2 >> 0x14 & 1) != 0) goto code_r0x0010d19d;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"1",1);
    uVar2 = this->_value;
    if ((uVar2 >> 0x12 & 1) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a0,";",1);
      goto LAB_0010d0f9;
    }
LAB_0010d110:
    if ((uVar2 >> 0x16 & 1) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a0,";",1);
LAB_0010d12a:
      std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"7",1);
      uVar2 = this->_value;
    }
    if ((uVar2 >> 0x13 & 1) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a0,";",1);
LAB_0010d15f:
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
      uVar2 = this->_value;
    }
    if ((uVar2 >> 0x14 & 1) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a0,";",1);
code_r0x0010d19d:
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"m",1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a0,(input->_M_dataplus)._M_p,input->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\x1b[0m",4);
  std::__cxx11::stringbuf::str();
LAB_0010d1e9:
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string Color::colorize (const std::string& input)
{
#ifdef FEATURE_COLOR
  if (!nontrivial ())
    return input;

  int count = 0;
  std::stringstream result;

  // 256 color
  if (_value & _COLOR_256)
  {
    bool needTerminator = false;

    if (_value & _COLOR_UNDERLINE)
    {
      result << "\033[4m";
      needTerminator = true;
    }

    if (_value & _COLOR_INVERSE)
    {
      result << "\033[7m";
      needTerminator = true;
    }

    if (_value & _COLOR_HASFG)
    {
      result << "\033[38;5;" << (_value & _COLOR_FG) << "m";
      needTerminator = true;
    }

    if (_value & _COLOR_HASBG)
    {
      result << "\033[48;5;" << ((_value & _COLOR_BG) >> 8) << "m";
      needTerminator = true;
    }

    result << input;
    if (needTerminator)
      result << "\033[0m";

    return result.str ();
  }

  // 16 color
  else
  {
    result << "\033[";

    if (_value & _COLOR_BOLD)
    {
      if (count++) result << ";";
      result << "1";
    }

    if (_value & _COLOR_UNDERLINE)
    {
      if (count++) result << ";";
      result << "4";
    }

    if (_value & _COLOR_INVERSE)
    {
      if (count++) result << ";";
      result << "7";
    }

    if (_value & _COLOR_HASFG)
    {
      if (count++) result << ";";
      result << (29 + (_value & _COLOR_FG));
    }

    if (_value & _COLOR_HASBG)
    {
      if (count++) result << ";";
      result << ((_value & _COLOR_BRIGHT ? 99 : 39) + ((_value & _COLOR_BG) >> 8));
    }

    result << "m" << input << "\033[0m";
    return result.str ();
  }
#endif

  return input;
}